

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

void __thiscall
ThreadContext::RegisterProtoInlineCache
          (ThreadContext *this,InlineCache *inlineCache,PropertyId propertyId)

{
  bool bVar1;
  PropertyRecord *pPVar2;
  
  bVar1 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,TraceInlineCacheInvalidationPhase);
  if (bVar1) {
    pPVar2 = GetPropertyName(this,propertyId);
    Output::Print(L"InlineCacheInvalidation: registering proto cache 0x%p for property %s(%u)\n",
                  inlineCache,pPVar2 + 1,(ulong)(uint)propertyId);
    Output::Flush();
  }
  RegisterInlineCache(this,&this->protoInlineCacheByPropId,inlineCache,propertyId);
  return;
}

Assistant:

void
ThreadContext::RegisterProtoInlineCache(Js::InlineCache * inlineCache, Js::PropertyId propertyId)
{
    if (PHASE_TRACE1(Js::TraceInlineCacheInvalidationPhase))
    {
        Output::Print(_u("InlineCacheInvalidation: registering proto cache 0x%p for property %s(%u)\n"),
            inlineCache, GetPropertyName(propertyId)->GetBuffer(), propertyId);
        Output::Flush();
    }

    RegisterInlineCache(protoInlineCacheByPropId, inlineCache, propertyId);
}